

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

bool embree::avx::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float *pfVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  ulong uVar52;
  uint uVar53;
  long lVar54;
  ulong uVar55;
  long lVar56;
  ulong uVar57;
  ulong *puVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  int iVar62;
  bool bVar63;
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  uint uVar71;
  uint uVar72;
  undefined1 auVar69 [16];
  uint uVar73;
  undefined1 auVar70 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar88;
  float fVar90;
  float fVar91;
  float fVar92;
  undefined1 auVar89 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  NodeRef stack [564];
  ulong local_1318;
  undefined1 local_12f8 [8];
  float fStack_12f0;
  float fStack_12ec;
  float local_12e8;
  float fStack_12e4;
  float fStack_12e0;
  float fStack_12dc;
  float local_1228;
  float fStack_1224;
  float fStack_1220;
  float fStack_121c;
  size_t local_11d8;
  ulong local_11d0 [564];
  
  puVar58 = local_11d0;
  local_11d8 = root.ptr;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4);
  auVar64._4_4_ = uVar2;
  auVar64._0_4_ = uVar2;
  auVar64._8_4_ = uVar2;
  auVar64._12_4_ = uVar2;
  auVar64._16_4_ = uVar2;
  auVar64._20_4_ = uVar2;
  auVar64._24_4_ = uVar2;
  auVar64._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  auVar65._4_4_ = uVar2;
  auVar65._0_4_ = uVar2;
  auVar65._8_4_ = uVar2;
  auVar65._12_4_ = uVar2;
  auVar65._16_4_ = uVar2;
  auVar65._20_4_ = uVar2;
  auVar65._24_4_ = uVar2;
  auVar65._28_4_ = uVar2;
  uVar2 = *(undefined4 *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  auVar66._4_4_ = uVar2;
  auVar66._0_4_ = uVar2;
  auVar66._8_4_ = uVar2;
  auVar66._12_4_ = uVar2;
  auVar66._16_4_ = uVar2;
  auVar66._20_4_ = uVar2;
  auVar66._24_4_ = uVar2;
  auVar66._28_4_ = uVar2;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  fVar4 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  fVar5 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  uVar52 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar57 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar59 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar62 = (tray->tnear).field_0.i[k];
  auVar67._4_4_ = iVar62;
  auVar67._0_4_ = iVar62;
  auVar67._8_4_ = iVar62;
  auVar67._12_4_ = iVar62;
  auVar67._16_4_ = iVar62;
  auVar67._20_4_ = iVar62;
  auVar67._24_4_ = iVar62;
  auVar67._28_4_ = iVar62;
  iVar62 = (tray->tfar).field_0.i[k];
  auVar68._4_4_ = iVar62;
  auVar68._0_4_ = iVar62;
  auVar68._8_4_ = iVar62;
  auVar68._12_4_ = iVar62;
  auVar68._16_4_ = iVar62;
  auVar68._20_4_ = iVar62;
  auVar68._24_4_ = iVar62;
  auVar68._28_4_ = iVar62;
  bVar63 = true;
  do {
    uVar60 = puVar58[-1];
    puVar58 = puVar58 + -1;
    while ((uVar60 & 8) == 0) {
      auVar21 = vsubps_avx(*(undefined1 (*) [32])(uVar60 + 0x40 + uVar52),auVar64);
      auVar22._4_4_ = auVar21._4_4_ * fVar3;
      auVar22._0_4_ = auVar21._0_4_ * fVar3;
      auVar22._8_4_ = auVar21._8_4_ * fVar3;
      auVar22._12_4_ = auVar21._12_4_ * fVar3;
      auVar22._16_4_ = auVar21._16_4_ * fVar3;
      auVar22._20_4_ = auVar21._20_4_ * fVar3;
      auVar22._24_4_ = auVar21._24_4_ * fVar3;
      auVar22._28_4_ = auVar21._28_4_;
      auVar21 = vsubps_avx(*(undefined1 (*) [32])(uVar60 + 0x40 + uVar57),auVar65);
      auVar23._4_4_ = auVar21._4_4_ * fVar4;
      auVar23._0_4_ = auVar21._0_4_ * fVar4;
      auVar23._8_4_ = auVar21._8_4_ * fVar4;
      auVar23._12_4_ = auVar21._12_4_ * fVar4;
      auVar23._16_4_ = auVar21._16_4_ * fVar4;
      auVar23._20_4_ = auVar21._20_4_ * fVar4;
      auVar23._24_4_ = auVar21._24_4_ * fVar4;
      auVar23._28_4_ = auVar21._28_4_;
      auVar21 = vmaxps_avx(auVar22,auVar23);
      auVar22 = vsubps_avx(*(undefined1 (*) [32])(uVar60 + 0x40 + uVar59),auVar66);
      auVar24._4_4_ = auVar22._4_4_ * fVar5;
      auVar24._0_4_ = auVar22._0_4_ * fVar5;
      auVar24._8_4_ = auVar22._8_4_ * fVar5;
      auVar24._12_4_ = auVar22._12_4_ * fVar5;
      auVar24._16_4_ = auVar22._16_4_ * fVar5;
      auVar24._20_4_ = auVar22._20_4_ * fVar5;
      auVar24._24_4_ = auVar22._24_4_ * fVar5;
      auVar24._28_4_ = auVar22._28_4_;
      auVar22 = vmaxps_avx(auVar24,auVar67);
      auVar21 = vmaxps_avx(auVar21,auVar22);
      auVar22 = vsubps_avx(*(undefined1 (*) [32])(uVar60 + 0x40 + (uVar52 ^ 0x20)),auVar64);
      auVar25._4_4_ = auVar22._4_4_ * fVar3;
      auVar25._0_4_ = auVar22._0_4_ * fVar3;
      auVar25._8_4_ = auVar22._8_4_ * fVar3;
      auVar25._12_4_ = auVar22._12_4_ * fVar3;
      auVar25._16_4_ = auVar22._16_4_ * fVar3;
      auVar25._20_4_ = auVar22._20_4_ * fVar3;
      auVar25._24_4_ = auVar22._24_4_ * fVar3;
      auVar25._28_4_ = auVar22._28_4_;
      auVar22 = vsubps_avx(*(undefined1 (*) [32])(uVar60 + 0x40 + (uVar57 ^ 0x20)),auVar65);
      auVar26._4_4_ = auVar22._4_4_ * fVar4;
      auVar26._0_4_ = auVar22._0_4_ * fVar4;
      auVar26._8_4_ = auVar22._8_4_ * fVar4;
      auVar26._12_4_ = auVar22._12_4_ * fVar4;
      auVar26._16_4_ = auVar22._16_4_ * fVar4;
      auVar26._20_4_ = auVar22._20_4_ * fVar4;
      auVar26._24_4_ = auVar22._24_4_ * fVar4;
      auVar26._28_4_ = auVar22._28_4_;
      auVar22 = vminps_avx(auVar25,auVar26);
      auVar23 = vsubps_avx(*(undefined1 (*) [32])(uVar60 + 0x40 + (uVar59 ^ 0x20)),auVar66);
      auVar27._4_4_ = auVar23._4_4_ * fVar5;
      auVar27._0_4_ = auVar23._0_4_ * fVar5;
      auVar27._8_4_ = auVar23._8_4_ * fVar5;
      auVar27._12_4_ = auVar23._12_4_ * fVar5;
      auVar27._16_4_ = auVar23._16_4_ * fVar5;
      auVar27._20_4_ = auVar23._20_4_ * fVar5;
      auVar27._24_4_ = auVar23._24_4_ * fVar5;
      auVar27._28_4_ = auVar23._28_4_;
      auVar23 = vminps_avx(auVar27,auVar68);
      auVar22 = vminps_avx(auVar22,auVar23);
      auVar21 = vcmpps_avx(auVar21,auVar22,2);
      uVar53 = vmovmskps_avx(auVar21);
      if (uVar53 == 0) goto LAB_003ea8dc;
      uVar55 = uVar60 & 0xfffffffffffffff0;
      lVar54 = 0;
      if ((byte)uVar53 != 0) {
        for (; ((byte)uVar53 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
        }
      }
      uVar60 = *(ulong *)(uVar55 + lVar54 * 8);
      uVar53 = (uVar53 & 0xff) - 1 & uVar53 & 0xff;
      if (uVar53 != 0) {
        *puVar58 = uVar60;
        puVar58 = puVar58 + 1;
        lVar54 = 0;
        if (uVar53 != 0) {
          for (; (uVar53 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
          }
        }
        uVar60 = *(ulong *)(uVar55 + lVar54 * 8);
        uVar53 = uVar53 - 1 & uVar53;
        uVar61 = (ulong)uVar53;
        if (uVar53 != 0) {
          do {
            *puVar58 = uVar60;
            puVar58 = puVar58 + 1;
            lVar54 = 0;
            if (uVar61 != 0) {
              for (; (uVar61 >> lVar54 & 1) == 0; lVar54 = lVar54 + 1) {
              }
            }
            uVar60 = *(ulong *)(uVar55 + lVar54 * 8);
            uVar61 = uVar61 & uVar61 - 1;
          } while (uVar61 != 0);
        }
      }
    }
    uVar55 = (ulong)((uint)uVar60 & 0xf);
    if (uVar55 != 8) {
      uVar60 = uVar60 & 0xfffffffffffffff0;
      uVar2 = *(undefined4 *)(ray + k * 4);
      uVar6 = *(undefined4 *)(ray + k * 4 + 0x10);
      uVar7 = *(undefined4 *)(ray + k * 4 + 0x20);
      fVar8 = *(float *)(ray + k * 4 + 0x40);
      fVar9 = *(float *)(ray + k * 4 + 0x50);
      fVar10 = *(float *)(ray + k * 4 + 0x60);
      lVar54 = 0;
      do {
        lVar56 = lVar54 * 0xb0;
        pfVar1 = (float *)(uVar60 + 0x80 + lVar56);
        fVar28 = *pfVar1;
        fVar29 = pfVar1[1];
        fVar30 = pfVar1[2];
        fVar31 = pfVar1[3];
        pfVar1 = (float *)(uVar60 + 0x40 + lVar56);
        fVar32 = *pfVar1;
        fVar33 = pfVar1[1];
        fVar34 = pfVar1[2];
        fVar35 = pfVar1[3];
        auVar78._0_4_ = fVar28 * fVar32;
        auVar78._4_4_ = fVar29 * fVar33;
        auVar78._8_4_ = fVar30 * fVar34;
        auVar78._12_4_ = fVar31 * fVar35;
        pfVar1 = (float *)(uVar60 + 0x70 + lVar56);
        fVar36 = *pfVar1;
        fVar37 = pfVar1[1];
        fVar38 = pfVar1[2];
        fVar39 = pfVar1[3];
        pfVar1 = (float *)(uVar60 + 0x50 + lVar56);
        fVar40 = *pfVar1;
        fVar41 = pfVar1[1];
        fVar42 = pfVar1[2];
        fVar43 = pfVar1[3];
        auVar79._0_4_ = fVar36 * fVar40;
        auVar79._4_4_ = fVar37 * fVar41;
        auVar79._8_4_ = fVar38 * fVar42;
        auVar79._12_4_ = fVar39 * fVar43;
        auVar69 = vsubps_avx(auVar79,auVar78);
        pfVar1 = (float *)(uVar60 + 0x60 + lVar56);
        fVar44 = *pfVar1;
        fVar45 = pfVar1[1];
        fVar46 = pfVar1[2];
        fVar47 = pfVar1[3];
        local_12f8._4_4_ = fVar41 * fVar45;
        local_12f8._0_4_ = fVar40 * fVar44;
        fStack_12f0 = fVar42 * fVar46;
        fStack_12ec = fVar43 * fVar47;
        auVar19._4_4_ = uVar2;
        auVar19._0_4_ = uVar2;
        auVar19._8_4_ = uVar2;
        auVar19._12_4_ = uVar2;
        auVar19 = vsubps_avx(*(undefined1 (*) [16])(uVar60 + lVar56),auVar19);
        auVar89._4_4_ = uVar6;
        auVar89._0_4_ = uVar6;
        auVar89._8_4_ = uVar6;
        auVar89._12_4_ = uVar6;
        auVar89 = vsubps_avx(*(undefined1 (*) [16])(uVar60 + 0x10 + lVar56),auVar89);
        auVar20._4_4_ = uVar7;
        auVar20._0_4_ = uVar7;
        auVar20._8_4_ = uVar7;
        auVar20._12_4_ = uVar7;
        auVar20 = vsubps_avx(*(undefined1 (*) [16])(uVar60 + 0x20 + lVar56),auVar20);
        pfVar1 = (float *)(uVar60 + 0x30 + lVar56);
        fVar48 = *pfVar1;
        fVar49 = pfVar1[1];
        fVar50 = pfVar1[2];
        fVar51 = pfVar1[3];
        auVar84._0_4_ = fVar28 * fVar48;
        auVar84._4_4_ = fVar29 * fVar49;
        auVar84._8_4_ = fVar30 * fVar50;
        auVar84._12_4_ = fVar31 * fVar51;
        auVar75 = vsubps_avx(auVar84,_local_12f8);
        auVar93._0_4_ = fVar36 * fVar48;
        auVar93._4_4_ = fVar37 * fVar49;
        auVar93._8_4_ = fVar38 * fVar50;
        auVar93._12_4_ = fVar39 * fVar51;
        auVar85._0_4_ = fVar44 * fVar32;
        auVar85._4_4_ = fVar45 * fVar33;
        auVar85._8_4_ = fVar46 * fVar34;
        auVar85._12_4_ = fVar47 * fVar35;
        auVar78 = vsubps_avx(auVar85,auVar93);
        fVar11 = auVar20._0_4_;
        auVar74._0_4_ = fVar9 * fVar11;
        fVar13 = auVar20._4_4_;
        auVar74._4_4_ = fVar9 * fVar13;
        fVar15 = auVar20._8_4_;
        auVar74._8_4_ = fVar9 * fVar15;
        fVar17 = auVar20._12_4_;
        auVar74._12_4_ = fVar9 * fVar17;
        fVar12 = auVar89._0_4_;
        auVar86._0_4_ = fVar10 * fVar12;
        fVar14 = auVar89._4_4_;
        auVar86._4_4_ = fVar10 * fVar14;
        fVar16 = auVar89._8_4_;
        auVar86._8_4_ = fVar10 * fVar16;
        fVar18 = auVar89._12_4_;
        auVar86._12_4_ = fVar10 * fVar18;
        auVar89 = vsubps_avx(auVar86,auVar74);
        fVar88 = auVar19._0_4_;
        auVar87._0_4_ = fVar88 * fVar10;
        fVar90 = auVar19._4_4_;
        auVar87._4_4_ = fVar90 * fVar10;
        fVar91 = auVar19._8_4_;
        auVar87._8_4_ = fVar91 * fVar10;
        fVar92 = auVar19._12_4_;
        auVar87._12_4_ = fVar92 * fVar10;
        auVar94._0_4_ = fVar8 * fVar11;
        auVar94._4_4_ = fVar8 * fVar13;
        auVar94._8_4_ = fVar8 * fVar15;
        auVar94._12_4_ = fVar8 * fVar17;
        auVar19 = vsubps_avx(auVar94,auVar87);
        auVar95._0_4_ = fVar8 * fVar12;
        auVar95._4_4_ = fVar8 * fVar14;
        auVar95._8_4_ = fVar8 * fVar16;
        auVar95._12_4_ = fVar8 * fVar18;
        auVar80._0_4_ = fVar9 * fVar88;
        auVar80._4_4_ = fVar9 * fVar90;
        auVar80._8_4_ = fVar9 * fVar91;
        auVar80._12_4_ = fVar9 * fVar92;
        auVar20 = vsubps_avx(auVar80,auVar95);
        local_12f8._0_4_ = auVar75._0_4_;
        local_12f8._4_4_ = auVar75._4_4_;
        fStack_12f0 = auVar75._8_4_;
        fStack_12ec = auVar75._12_4_;
        local_12e8 = auVar69._0_4_;
        fStack_12e4 = auVar69._4_4_;
        fStack_12e0 = auVar69._8_4_;
        fStack_12dc = auVar69._12_4_;
        auVar96._0_4_ =
             fVar8 * local_12e8 + fVar9 * (float)local_12f8._0_4_ + auVar78._0_4_ * fVar10;
        auVar96._4_4_ =
             fVar8 * fStack_12e4 + fVar9 * (float)local_12f8._4_4_ + auVar78._4_4_ * fVar10;
        auVar96._8_4_ = fVar8 * fStack_12e0 + fVar9 * fStack_12f0 + auVar78._8_4_ * fVar10;
        auVar96._12_4_ = fVar8 * fStack_12dc + fVar9 * fStack_12ec + auVar78._12_4_ * fVar10;
        local_1228 = auVar89._0_4_;
        fStack_1224 = auVar89._4_4_;
        fStack_1220 = auVar89._8_4_;
        fStack_121c = auVar89._12_4_;
        auVar69._8_4_ = 0x80000000;
        auVar69._0_8_ = 0x8000000080000000;
        auVar69._12_4_ = 0x80000000;
        auVar69 = vandps_avx(auVar96,auVar69);
        uVar53 = auVar69._0_4_;
        auVar75._0_4_ =
             (float)(uVar53 ^ (uint)(local_1228 * fVar44 +
                                    auVar20._0_4_ * fVar28 + auVar19._0_4_ * fVar36));
        uVar71 = auVar69._4_4_;
        auVar75._4_4_ =
             (float)(uVar71 ^ (uint)(fStack_1224 * fVar45 +
                                    auVar20._4_4_ * fVar29 + auVar19._4_4_ * fVar37));
        uVar72 = auVar69._8_4_;
        auVar75._8_4_ =
             (float)(uVar72 ^ (uint)(fStack_1220 * fVar46 +
                                    auVar20._8_4_ * fVar30 + auVar19._8_4_ * fVar38));
        uVar73 = auVar69._12_4_;
        auVar75._12_4_ =
             (float)(uVar73 ^ (uint)(fStack_121c * fVar47 +
                                    auVar20._12_4_ * fVar31 + auVar19._12_4_ * fVar39));
        auVar81._0_4_ =
             (float)(uVar53 ^ (uint)(local_1228 * fVar48 +
                                    auVar20._0_4_ * fVar40 + auVar19._0_4_ * fVar32));
        auVar81._4_4_ =
             (float)(uVar71 ^ (uint)(fStack_1224 * fVar49 +
                                    auVar20._4_4_ * fVar41 + auVar19._4_4_ * fVar33));
        auVar81._8_4_ =
             (float)(uVar72 ^ (uint)(fStack_1220 * fVar50 +
                                    auVar20._8_4_ * fVar42 + auVar19._8_4_ * fVar34));
        auVar81._12_4_ =
             (float)(uVar73 ^ (uint)(fStack_121c * fVar51 +
                                    auVar20._12_4_ * fVar43 + auVar19._12_4_ * fVar35));
        auVar89 = ZEXT816(0) << 0x40;
        auVar69 = vcmpps_avx(auVar75,auVar89,5);
        auVar19 = vcmpps_avx(auVar81,auVar89,5);
        auVar69 = vandps_avx(auVar69,auVar19);
        auVar19 = vcmpps_avx(auVar96,auVar89,4);
        auVar69 = vandps_avx(auVar69,auVar19);
        auVar82._0_4_ = auVar75._0_4_ + auVar81._0_4_;
        auVar82._4_4_ = auVar75._4_4_ + auVar81._4_4_;
        auVar82._8_4_ = auVar75._8_4_ + auVar81._8_4_;
        auVar82._12_4_ = auVar75._12_4_ + auVar81._12_4_;
        auVar76._8_4_ = 0x7fffffff;
        auVar76._0_8_ = 0x7fffffff7fffffff;
        auVar76._12_4_ = 0x7fffffff;
        auVar19 = vandps_avx(auVar96,auVar76);
        auVar89 = vcmpps_avx(auVar82,auVar19,2);
        auVar20 = auVar89 & auVar69;
        if ((((auVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
             (auVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar20 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            auVar20[0xf] < '\0') {
          auVar69 = vandps_avx(auVar69,auVar89);
          auVar70._0_4_ =
               uVar53 ^ (uint)(fVar88 * local_12e8 +
                              (float)local_12f8._0_4_ * fVar12 + auVar78._0_4_ * fVar11);
          auVar70._4_4_ =
               uVar71 ^ (uint)(fVar90 * fStack_12e4 +
                              (float)local_12f8._4_4_ * fVar14 + auVar78._4_4_ * fVar13);
          auVar70._8_4_ =
               uVar72 ^ (uint)(fVar91 * fStack_12e0 + fStack_12f0 * fVar16 + auVar78._8_4_ * fVar15)
          ;
          auVar70._12_4_ =
               uVar73 ^ (uint)(fVar92 * fStack_12dc + fStack_12ec * fVar18 + auVar78._12_4_ * fVar17
                              );
          fVar11 = *(float *)(ray + k * 4 + 0x30);
          auVar83._0_4_ = auVar19._0_4_ * fVar11;
          auVar83._4_4_ = auVar19._4_4_ * fVar11;
          auVar83._8_4_ = auVar19._8_4_ * fVar11;
          auVar83._12_4_ = auVar19._12_4_ * fVar11;
          auVar89 = vcmpps_avx(auVar83,auVar70,1);
          fVar11 = *(float *)(ray + k * 4 + 0x80);
          auVar77._0_4_ = auVar19._0_4_ * fVar11;
          auVar77._4_4_ = auVar19._4_4_ * fVar11;
          auVar77._8_4_ = auVar19._8_4_ * fVar11;
          auVar77._12_4_ = auVar19._12_4_ * fVar11;
          auVar19 = vcmpps_avx(auVar70,auVar77,2);
          auVar19 = vandps_avx(auVar89,auVar19);
          auVar69 = vandps_avx(auVar19,auVar69);
          iVar62 = vmovmskps_avx(auVar69);
          if (iVar62 != 0) {
            local_1318._0_1_ = (byte)iVar62;
            local_1318 = (ulong)(byte)local_1318;
            do {
              uVar61 = 0;
              if (local_1318 != 0) {
                for (; (local_1318 >> uVar61 & 1) == 0; uVar61 = uVar61 + 1) {
                }
              }
              if ((((context->scene->geometries).items
                    [*(uint *)(lVar56 + uVar60 + 0x90 + uVar61 * 4)].ptr)->mask &
                  *(uint *)(ray + k * 4 + 0x90)) != 0) {
                *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
                return bVar63;
              }
              local_1318 = local_1318 ^ 1L << (uVar61 & 0x3f);
            } while (local_1318 != 0);
          }
        }
        lVar54 = lVar54 + 1;
      } while (lVar54 != uVar55 - 8);
    }
LAB_003ea8dc:
    bVar63 = puVar58 != &local_11d8;
    if (!bVar63) {
      return bVar63;
    }
  } while( true );
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }